

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
               (CodedInputStream *input,float *value)

{
  float *pfVar1;
  bool bVar2;
  uint32_t temp;
  float local_c;
  
  pfVar1 = (float *)input->buffer_;
  if (*(int *)&input->buffer_end_ - (int)pfVar1 < 4) {
    bVar2 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)&local_c);
  }
  else {
    local_c = *pfVar1;
    input->buffer_ = (uint8_t *)(pfVar1 + 1);
    bVar2 = true;
  }
  if (bVar2 != false) {
    *value = local_c;
  }
  return bVar2;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<float, WireFormatLite::TYPE_FLOAT>(
    io::CodedInputStream* input, float* value) {
  uint32_t temp;
  if (!input->ReadLittleEndian32(&temp)) return false;
  *value = DecodeFloat(temp);
  return true;
}